

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_Accumulate(AccumulateForm2 Accumulate)

{
  value_type vVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last_00;
  code *pcVar2;
  byte bVar3;
  uint uVar4;
  anon_class_8_1_a81546ea aVar5;
  size_type sVar6;
  reference pvVar7;
  code *in_RDI;
  uint32_t sum;
  size_t imageId;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_fffffffffffffe88;
  uint32_t in_stack_fffffffffffffe8c;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  value_type_conflict3 *in_stack_fffffffffffffea0;
  anon_class_8_1_ba1d79ab __pred;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffeb0;
  uint32_t *height;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *width;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff08;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_ffffffffffffff10;
  ulong local_c8;
  undefined1 local_b8 [24];
  undefined4 local_a0;
  undefined4 local_9c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_68;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_50;
  uchar *local_48;
  uchar *local_40;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_38;
  uint32_t local_20 [6];
  code *local_8;
  
  local_8 = in_RDI;
  Test_Helper::randomValue<unsigned_char>
            ((uchar)((ulong)in_stack_fffffffffffffe90._M_current >> 0x30),
             (uint32_t)in_stack_fffffffffffffe90._M_current);
  height = local_20;
  Unit_Test::intensityArray(in_stack_fffffffffffffe8c);
  width = &local_38;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            *)0x1ccf05);
  local_40 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  local_48 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  __first._M_current._7_1_ = in_stack_fffffffffffffe9f;
  __first._M_current._0_7_ = in_stack_fffffffffffffe98;
  aVar5.input._4_4_ = in_stack_fffffffffffffe8c;
  aVar5.input._0_4_ = in_stack_fffffffffffffe88;
  local_50 = width;
  aVar5 = std::
          for_each<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,Function_Template::form2_Accumulate(void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>&))::__0>
                    (__first,in_stack_fffffffffffffe90,aVar5);
  local_68 = (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)aVar5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1ccf7c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1ccf8e);
  Unit_Test::generateRoi
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)aVar5.input,(uint32_t *)width,
             height);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1ccfea);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffeb0._M_current,
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0
             ,(allocator_type *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1cd018);
  local_c8 = 0;
  while( true ) {
    sVar6 = std::
            vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            ::size(&local_38);
    pcVar2 = local_8;
    if (sVar6 <= local_c8) break;
    in_stack_fffffffffffffeb0._M_current =
         (uint *)std::
                 vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 ::operator[](&local_38,local_c8);
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_80,local_c8);
    vVar1 = *pvVar7;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_98,local_c8);
    (*pcVar2)(in_stack_fffffffffffffeb0._M_current,vVar1,*pvVar7,local_9c,local_a0,local_b8);
    local_c8 = local_c8 + 1;
  }
  __pred.sum = local_20;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  __last._M_current._4_4_ = in_stack_fffffffffffffe8c;
  __last._M_current._0_4_ = in_stack_fffffffffffffe88;
  uVar4 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_int>
                    (in_stack_fffffffffffffe90,__last,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  __last_00._M_current._4_4_ = uVar4;
  __last_00._M_current._0_4_ = in_stack_fffffffffffffea8;
  bVar3 = std::
          all_of<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,Function_Template::form2_Accumulate(void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>&))::__1>
                    (in_stack_fffffffffffffeb0,__last_00,__pred);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__pred.sum);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__pred.sum);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__pred.sum);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)__pred.sum);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__pred.sum);
  return (bool)(bVar3 & 1);
}

Assistant:

bool form2_Accumulate(AccumulateForm2 Accumulate)
    {
        const std::vector < uint8_t > intensity = intensityArray( randomValue<uint8_t>( 1, 16 ) );
        std::vector < PenguinV_Image::Image > input;

        std::for_each( intensity.begin(), intensity.end(), [&]( uint8_t value )
        { input.push_back( uniformImage( value ) ); } );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        std::vector < uint32_t > result( roiWidth * roiHeight, 0 );

        for( size_t imageId = 0; imageId < input.size(); ++imageId ) {
            Accumulate( input[imageId], roiX[imageId], roiY[imageId], roiWidth, roiHeight, result );
        }

        const uint32_t sum = std::accumulate( intensity.begin(), intensity.end(), 0u );

        return std::all_of( result.begin(), result.end(), [&sum]( uint32_t v ) { return v == sum; } );
    }